

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueCallbacks.cpp
# Opt level: O0

shared_ptr<BER_CONTAINER> __thiscall OIDCallback::buildTypeWithValue(OIDCallback *this)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<BER_CONTAINER> sVar2;
  undefined1 local_28 [8];
  shared_ptr<OIDType> oid;
  OIDCallback *this_local;
  
  std::make_shared<OIDType,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28);
  peVar1 = Catch::clara::std::__shared_ptr_access<OIDType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<OIDType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_28);
  if ((peVar1->valid & 1U) == 0) {
    std::shared_ptr<BER_CONTAINER>::shared_ptr((shared_ptr<BER_CONTAINER> *)this,(nullptr_t)0x0);
  }
  else {
    std::shared_ptr<BER_CONTAINER>::shared_ptr<OIDType,void>
              ((shared_ptr<BER_CONTAINER> *)this,(shared_ptr<OIDType> *)local_28);
  }
  Catch::clara::std::shared_ptr<OIDType>::~shared_ptr((shared_ptr<OIDType> *)local_28);
  sVar2.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<BER_CONTAINER>)
         sVar2.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BER_CONTAINER> OIDCallback::buildTypeWithValue(){
    auto oid = std::make_shared<OIDType>(this->value);
    if(!oid->valid) return nullptr;
    return oid;
}